

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  num_writer f;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int num_digits;
  size_type sVar9;
  string_view prefix;
  string groups;
  undefined4 uStack_54;
  undefined7 uStack_47;
  string local_40;
  
  grouping_impl<char>(&local_40,(locale_ref)(this->writer->locale_).locale_);
  if (local_40._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar1 = this->specs->thousands;
    if (cVar1 == '\0') {
      on_dec(this);
    }
    else {
      uVar3 = this->abs_value;
      lVar4 = 0x3f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar7 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      iVar8 = (uVar7 + 1) -
              (uint)(uVar3 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar7 * 8
                                       ));
      num_digits = (int)local_40._M_string_length + iVar8;
      sVar9 = 0;
      iVar5 = iVar8;
      do {
        cVar2 = local_40._M_dataplus._M_p[sVar9];
        iVar6 = iVar5 - cVar2;
        if ((iVar6 == 0 || iVar5 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
          num_digits = iVar8 + (int)sVar9;
          iVar6 = iVar5;
          if (local_40._M_string_length != sVar9) goto LAB_0029a6eb;
          break;
        }
        sVar9 = sVar9 + 1;
        iVar5 = iVar6;
      } while (local_40._M_string_length != sVar9);
      num_digits = (iVar6 + -1) / (int)local_40._M_dataplus._M_p[local_40._M_string_length - 1] +
                   num_digits;
LAB_0029a6eb:
      f._12_4_ = uStack_54;
      f.size = num_digits;
      f._25_7_ = uStack_47;
      f.sep = cVar1;
      f.abs_value = uVar3;
      f.groups = &local_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }